

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_lattice_t * ps_lattice_init_search(ps_search_t *search,int n_frame)

{
  ps_lattice_t *ppVar1;
  dict_t *pdVar2;
  logmath_t *plVar3;
  long lVar4;
  listelem_alloc_t *plVar5;
  ps_lattice_t *dag;
  int n_frame_local;
  ps_search_t *search_local;
  
  ppVar1 = (ps_lattice_t *)
           __ckd_calloc__(1,0x80,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                          ,0x281);
  ppVar1->search = search;
  pdVar2 = dict_retain(search->dict);
  ppVar1->dict = pdVar2;
  plVar3 = logmath_retain(search->acmod->lmath);
  ppVar1->lmath = plVar3;
  lVar4 = ps_config_int(ppVar1->search->config,"frate");
  ppVar1->frate = (int32)lVar4;
  ppVar1->silence = ppVar1->dict->silwid;
  ppVar1->n_frames = n_frame;
  plVar5 = listelem_alloc_init(0x48);
  ppVar1->latnode_alloc = plVar5;
  plVar5 = listelem_alloc_init(0x30);
  ppVar1->latlink_alloc = plVar5;
  plVar5 = listelem_alloc_init(0x10);
  ppVar1->latlink_list_alloc = plVar5;
  ppVar1->refcount = 1;
  return ppVar1;
}

Assistant:

ps_lattice_t *
ps_lattice_init_search(ps_search_t *search, int n_frame)
{
    ps_lattice_t *dag;

    dag = ckd_calloc(1, sizeof(*dag));
    dag->search = search;
    dag->dict = dict_retain(search->dict);
    dag->lmath = logmath_retain(search->acmod->lmath);
    dag->frate = ps_config_int(dag->search->config, "frate");
    dag->silence = dict_silwid(dag->dict);
    dag->n_frames = n_frame;
    dag->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));
    dag->latlink_alloc = listelem_alloc_init(sizeof(ps_latlink_t));
    dag->latlink_list_alloc = listelem_alloc_init(sizeof(latlink_list_t));
    dag->refcount = 1;
    return dag;
}